

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

bool __thiscall Inline::GetInlineeHasArgumentObject(Inline *this,Func *inlinee)

{
  Instr **ppIVar1;
  OpCode OVar2;
  Inline *pIVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  OpndKind OVar7;
  BuiltinFunction BVar8;
  LocalFunctionId localFuncId;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar9;
  Instr *pIVar10;
  undefined **ppuVar11;
  char *this_01;
  Instr *instr;
  SymID argumentsSymId;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(inlinee->m_workItem);
  bVar5 = JITTimeFunctionBody::UsesArgumentsObject(this_00);
  if (bVar5) {
    if ((inlinee->field_0x241 & 0x10) == 0) {
      return true;
    }
    instr = inlinee->m_headInstr;
    argumentsSymId = 0;
    if (instr != (Instr *)0x0) {
      ppuVar11 = &PTR_01548f08;
      puVar9 = (undefined4 *)__tls_get_addr();
      pIVar10 = (Instr *)0x0;
      do {
        this_01 = (char *)ppuVar11;
        if ((pIVar10 != (Instr *)0x0) && (pIVar10->m_next != instr)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          this_01 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
          ;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x16a9,
                             "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                             "Modifying instr list but not using EDITING iterator!");
          if (!bVar5) goto LAB_005571f0;
          *puVar9 = 0;
        }
        if (instr->m_func == inlinee) {
          OVar2 = instr->m_opcode;
          if ((ushort)(OVar2 - LdHeapArguments) < 2) {
            pIVar3 = (Inline *)instr->m_dst;
            this_01 = (char *)pIVar3;
            OVar6 = IR::Opnd::GetKind((Opnd *)pIVar3);
            if (OVar6 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              this_01 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
              ;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar5) goto LAB_005571f0;
              *puVar9 = 0;
            }
            argumentsSymId = *(SymID *)(*(long *)&pIVar3->currentForInDepth + 0x10);
          }
          else if (argumentsSymId == 0) {
            argumentsSymId = 0;
          }
          else if (OVar2 < BytecodeArgOutCapture) {
            if (OVar2 != ArgOut_A_InlineBuiltIn) {
              if (OVar2 == ArgOut_A_FromStackArgs) {
                if (this->isInInlinedApplyCall == true) goto LAB_00557157;
              }
              else if (OVar2 != BailOnNotStackArgs) {
LAB_00557157:
                bVar5 = HasArgumentsAccess((Inline *)this_01,instr,argumentsSymId);
                if (bVar5) {
                  return true;
                }
              }
            }
          }
          else if (1 < OVar2 - 0x242) {
            if (OVar2 == InlineBuiltInEnd) {
              if (this->isInInlinedApplyCall == true) {
                this->isInInlinedApplyCall = false;
              }
            }
            else {
              if (OVar2 != InlineBuiltInStart) goto LAB_00557157;
              pIVar3 = (Inline *)instr->m_src1;
              OVar6 = IR::Opnd::GetKind((Opnd *)pIVar3);
              this_01 = (char *)pIVar3;
              OVar7 = IR::Opnd::GetKind((Opnd *)pIVar3);
              if (OVar6 == OpndKindAddr) {
                if (OVar7 != OpndKindAddr) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar9 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
                  if (!bVar5) goto LAB_005571f0;
                  *puVar9 = 0;
                }
                if (((ulong)pIVar3->lastStatementBoundary & 2) == 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar9 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x16c0,"(builtInOpnd->AsAddrOpnd()->m_isFunction)",
                                     "builtInOpnd->AsAddrOpnd()->m_isFunction");
                  if (!bVar5) goto LAB_005571f0;
                  *puVar9 = 0;
                }
                OVar6 = IR::Opnd::GetKind((Opnd *)pIVar3);
                if (OVar6 != OpndKindAddr) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar9 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
                  if (!bVar5) {
LAB_005571f0:
                    pcVar4 = (code *)invalidInstructionException();
                    (*pcVar4)();
                  }
                  *puVar9 = 0;
                }
                localFuncId = FixedFieldInfo::GetLocalFuncId
                                        (*(FixedFieldInfo **)&pIVar3->currentForInDepth);
                this_01 = (char *)(ulong)localFuncId;
                BVar8 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
              }
              else {
                if (OVar7 != OpndKindReg) goto LAB_005571ce;
                this_01 = (char *)pIVar3;
                OVar6 = IR::Opnd::GetKind((Opnd *)pIVar3);
                if (OVar6 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar9 = 1;
                  this_01 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                  ;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar5) goto LAB_005571f0;
                  *puVar9 = 0;
                }
                BVar8._value = *(byte *)(*(long *)&pIVar3->currentForInDepth + 0x1d);
              }
              if (BVar8._value == '<') {
                this->isInInlinedApplyCall = true;
              }
            }
          }
        }
LAB_005571ce:
        ppIVar1 = &instr->m_next;
        pIVar10 = instr;
        ppuVar11 = (undefined **)this_01;
        instr = *ppIVar1;
      } while (*ppIVar1 != (Instr *)0x0);
    }
  }
  return false;
}

Assistant:

bool
Inline::GetInlineeHasArgumentObject(Func * inlinee)
{
    if (!inlinee->GetJITFunctionBody()->UsesArgumentsObject())
    {
        // If inlinee has no arguments access return false
        return false;
    }

    // Inlinee has arguments access

    if (!inlinee->GetApplyTargetInliningRemovedArgumentsAccess())
    {
        return true;
    }

    // Its possible there is no more arguments access after we inline apply target; validate the same.
    // This sounds expensive, but we are only walking inlinee which has apply target inlining optimization enabled.
    // Also we walk only instruction in that inlinee and not nested inlinees. So it is not expensive.
    SymID argumentsSymId = 0;
    FOREACH_INSTR_IN_FUNC(instr, inlinee)
    {
        if (instr->m_func != inlinee)
        {
            // Skip nested inlinees
            continue;
        }

        if (instr->m_opcode == Js::OpCode::LdHeapArguments || instr->m_opcode == Js::OpCode::LdLetHeapArguments)
        {
            argumentsSymId = instr->GetDst()->AsRegOpnd()->m_sym->m_id;
        }
        else if (argumentsSymId != 0)
        {
            // Once we find the arguments object i.e. argumentsSymId is set
            // Make sure no one refers to it.
            switch (instr->m_opcode)
            {
                case Js::OpCode::InlineBuiltInStart:
                    {
                        IR::Opnd* builtInOpnd = instr->GetSrc1();
                        if (builtInOpnd->IsAddrOpnd())
                        {
                            Assert(builtInOpnd->AsAddrOpnd()->m_isFunction);

                            Js::BuiltinFunction builtinFunction = Js::JavascriptLibrary::GetBuiltInForFuncInfo(((FixedFieldInfo*)builtInOpnd->AsAddrOpnd()->m_metadata)->GetLocalFuncId());
                            if (builtinFunction == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        else if (builtInOpnd->IsRegOpnd())
                        {
                            if (builtInOpnd->AsRegOpnd()->m_sym->m_builtInIndex == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        break;
                    }

                case Js::OpCode::InlineBuiltInEnd:
                    {
                        if(this->GetIsInInlinedApplyCall())
                        {
                            this->SetIsInInlinedApplyCall(false);
                        }
                        break;
                    }

                case Js::OpCode::BailOnNotStackArgs:
                case Js::OpCode::ArgOut_A_InlineBuiltIn:
                case Js::OpCode::BytecodeArgOutCapture:
                case Js::OpCode::BytecodeArgOutUse:
                    // These are part of arguments optimization and we are fine if they access stack args.
                    break;

                case Js::OpCode::ArgOut_A_FromStackArgs:
                    {
                        // If ArgOut_A_FromStackArgs is part of the call sequence for apply built-in inlining (as opposed to apply target inlining),
                        // then arguments access continues to exist.
                        if (this->GetIsInInlinedApplyCall() && HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                        break;
                    }

                default:
                    {
                        if (HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                    }
            }
        }
    }
    NEXT_INSTR_IN_FUNC;
    return false;
}